

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
CreateTexture<unsigned_int,2,false,2u,true>(StorageAndSubImageTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLuint texture;
  GLenum target;
  GLint internalformat;
  GLsizei in_stack_ffffffffffffffc0;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_to);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bc);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bf);
  target = 0xde1;
  internalformat = 0x823c;
  TextureStorage<2u,true>(this,0xde1,texture,1,0x823c,2,3,in_stack_ffffffffffffffc0);
  bVar1 = TextureSubImage<2u,true>
                    (this,target,this->m_to,0,internalformat,2,3,in_stack_ffffffffffffffc0,0x8228,
                     0x1405,Reference::ReferenceData<unsigned_int,_false>::reference);
  if (!bVar1) {
    CleanTexture(this);
  }
  return bVar1;
}

Assistant:

bool StorageAndSubImageTest::CreateTexture()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(TextureTarget<D>(), m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	/* Storage creation. */
	if (TextureStorage<D, I>(TextureTarget<D>(), m_to, 1, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
							 TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>()))
	{
		/* Data setup. */
		if (TextureSubImage<D, I>(TextureTarget<D>(), m_to, 0, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
								  TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>(), Format<S, N>(), Type<T>(),
								  ReferenceData<T, N>()))
		{
			return true;
		}
	}

	CleanTexture();

	return false;
}